

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_scalar_umul128_unroll2(uint16_t *in,uint32_t n,uint32_t *out)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 *puVar33;
  undefined8 uVar34;
  uint uVar35;
  ulong uVar36;
  undefined8 uVar37;
  uint uVar38;
  undefined4 in_register_00000034;
  ulong uVar39;
  uint uVar40;
  undefined8 uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined8 uVar45;
  ulong uVar46;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar47 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 in_ZMM31 [64];
  undefined1 (*local_1a8) [16];
  undefined1 auVar96 [32];
  
  uVar39 = CONCAT44(in_register_00000034,n);
  local_1a8 = (undefined1 (*) [16])in;
  if (7 < n) {
    auVar60 = vmovdqu64_avx512f(*(undefined1 (*) [64])out);
    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    auVar62 = vpbroadcastq_avx512f(ZEXT816(0x1111111111111111));
    auVar63 = vpbroadcastq_avx512f(ZEXT816(0x2222222222222222));
    auVar64 = vpbroadcastq_avx512f(ZEXT816(0x4444444444444444));
    auVar65 = vpbroadcastq_avx512f(ZEXT816(0xf00f00f00f));
    do {
      uVar38 = (uint)uVar39;
      uVar40 = 0xfff;
      if (uVar38 < 0xfff) {
        uVar40 = uVar38;
      }
      uVar40 = uVar40 & 0xff8;
      if (uVar40 == 0) {
        uVar41 = 0;
        uVar45 = 0;
        uVar37 = 0;
        uVar34 = 0;
      }
      else {
        auVar118 = ZEXT1664((undefined1  [16])0x0);
        auVar117 = ZEXT1664((undefined1  [16])0x0);
        auVar116 = ZEXT1664((undefined1  [16])0x0);
        auVar47 = vpxord_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        in_ZMM31 = ZEXT1664(auVar47);
        auVar60 = vmovdqu64_avx512f(auVar60);
        puVar33 = *local_1a8;
        uVar35 = 0xfff;
        if (uVar38 < 0xfff) {
          uVar35 = uVar38;
        }
        auVar66 = vpbroadcastq_avx512f();
        auVar66 = vpsrlq_avx512f(auVar66,4);
        auVar66 = vmovdqu64_avx512f(auVar66);
        uVar36 = 0;
        uVar44 = uVar39;
        do {
          auVar67 = vpbroadcastq_avx512f();
          auVar61 = vporq_avx512f(auVar67,auVar61);
          uVar3 = vpcmpuq_avx512f(auVar61,auVar66,2);
          auVar67 = vpgatherdq_avx512f(*(undefined4 *)(*local_1a8 + uVar44));
          bVar1 = (byte)uVar3;
          auVar61._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar67._8_8_;
          auVar61._0_8_ = (ulong)(bVar1 & 1) * auVar67._0_8_;
          auVar61._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar67._16_8_;
          auVar61._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar67._24_8_;
          auVar61._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar67._32_8_;
          auVar61._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar67._40_8_;
          auVar61._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar67._48_8_;
          auVar61._56_8_ = (uVar3 >> 7) * auVar67._56_8_;
          auVar67 = vpgatherdq_avx512f(*(undefined4 *)(*local_1a8 + uVar44 + 8));
          auVar71._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar67._8_8_;
          auVar71._0_8_ = (ulong)(bVar1 & 1) * auVar67._0_8_;
          auVar71._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar67._16_8_;
          auVar71._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar67._24_8_;
          auVar71._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar67._32_8_;
          auVar71._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar67._40_8_;
          auVar71._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar67._48_8_;
          auVar71._56_8_ = (uVar3 >> 7) * auVar67._56_8_;
          auVar67 = vpandq_avx512f(auVar61,auVar63);
          auVar63 = vpandq_avx512f(auVar71,auVar63);
          auVar68 = vpandq_avx512f(auVar61,auVar62);
          auVar69 = vpandq_avx512f(auVar71,auVar62);
          auVar70 = vpandq_avx512f(auVar61,auVar64);
          auVar61 = vpsrlq_avx512f(auVar61,3);
          auVar63 = vpaddq_avx512f(auVar63,auVar67);
          auVar67 = vpaddq_avx512f(auVar69,auVar68);
          auVar61 = vpandq_avx512f(auVar61,auVar62);
          auVar63 = vpsrlq_avx512f(auVar63,1);
          auVar68 = vpandq_avx512f(auVar71,auVar64);
          auVar71 = vpsrlq_avx512f(auVar71,3);
          uVar44 = vpextrq_avx(auVar67._0_16_,1);
          auVar71 = vpandq_avx512f(auVar71,auVar62);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = auVar67._0_8_;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar44;
          auVar68 = vpaddq_avx512f(auVar68,auVar70);
          auVar62 = vmovdqa64_avx512f(auVar62);
          auVar71 = vpaddq_avx512f(auVar71,auVar61);
          auVar55 = vextracti64x4_avx512f(auVar67,1);
          auVar68 = vpsrlq_avx512f(auVar68,2);
          uVar44 = vpextrq_avx(auVar55._0_16_,1);
          uVar43 = vpextrq_avx(auVar67._16_16_,1);
          uVar42 = vpextrq_avx(auVar55._16_16_,1);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = auVar67._16_8_;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar43;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = auVar55._0_8_;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar44;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = auVar55._16_8_;
          uVar44 = vpextrq_avx(auVar63._0_16_,1);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar42;
          auVar78._8_8_ = 0;
          auVar78._0_8_ = SUB168(auVar7 * ZEXT816(0x1000100010001),8);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = SUB168(auVar49 * ZEXT816(0x1000100010001),8);
          auVar47 = vpunpcklqdq_avx(auVar81,auVar78);
          auVar82._8_8_ = 0;
          auVar82._0_8_ = SUB168(auVar6 * ZEXT816(0x1000100010001),8);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = SUB168(auVar5 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx(auVar87,auVar82);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = SUB168(auVar4 * ZEXT816(0x1000100010001),8);
          auVar98._8_8_ = 0;
          auVar98._0_8_ = SUB168(auVar50 * ZEXT816(0x1000100010001),8);
          auVar51 = vpunpcklqdq_avx(auVar98,auVar88);
          auVar74._8_8_ = 0;
          auVar74._0_8_ = SUB168(auVar48 * ZEXT816(0x1000100010001),8);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = SUB168(auVar8 * ZEXT816(0x1000100010001),8);
          auVar53 = vpunpcklqdq_avx(auVar74,auVar103);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = SUB168(auVar8 * ZEXT816(0x1000100010001),0);
          auVar99._8_8_ = 0;
          auVar99._0_8_ = SUB168(auVar48 * ZEXT816(0x1000100010001),0);
          auVar48 = vpunpcklqdq_avx(auVar99,auVar89);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = auVar63._0_8_;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar44;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar7 * ZEXT816(0x1000100010001),0);
          auVar104._8_8_ = 0;
          auVar104._0_8_ = SUB168(auVar49 * ZEXT816(0x1000100010001),0);
          auVar49 = vpunpcklqdq_avx(auVar104,auVar100);
          auVar56._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar47;
          auVar56._16_16_ = ZEXT116(1) * auVar53;
          auVar55 = vextracti64x4_avx512f(auVar63,1);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = SUB168(auVar6 * ZEXT816(0x1000100010001),0);
          auVar113._8_8_ = 0;
          auVar113._0_8_ = SUB168(auVar5 * ZEXT816(0x1000100010001),0);
          auVar47 = vpunpcklqdq_avx(auVar113,auVar105);
          auVar57._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar49;
          auVar57._16_16_ = ZEXT116(1) * auVar48;
          uVar42 = vpextrq_avx(auVar55._0_16_,1);
          auVar61 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar52,
                                                   ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51)),
                               auVar56,1);
          auVar130._8_8_ = 0;
          auVar130._0_8_ = SUB168(auVar10 * ZEXT816(0x1000100010001),0);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = SUB168(auVar4 * ZEXT816(0x1000100010001),0);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = SUB168(auVar50 * ZEXT816(0x1000100010001),0);
          auVar52 = vpunpcklqdq_avx(auVar114,auVar106);
          auVar67 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar47,
                                                   ZEXT116(0) * auVar47 + ZEXT116(1) * auVar52)),
                               auVar57,1);
          uVar44 = vpextrq_avx(auVar55._16_16_,1);
          auVar69 = vmovdqa64_avx512f(auVar64);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = SUB168(auVar9 * ZEXT816(0x1000100010001),0);
          auVar48 = vpunpcklqdq_avx512vl(auVar132,auVar130);
          uVar43 = vpextrq_avx(auVar63._16_16_,1);
          auVar64 = vpaddq_avx512f(auVar61,auVar67);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = auVar63._16_8_;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar43;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = auVar55._0_8_;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar42;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = auVar55._16_8_;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = SUB168(auVar10 * ZEXT816(0x1000100010001),8);
          auVar107._8_8_ = 0;
          auVar107._0_8_ = SUB168(auVar9 * ZEXT816(0x1000100010001),8);
          auVar47 = vpunpcklqdq_avx(auVar107,auVar101);
          auVar61 = vmovdqu64_avx512f(auVar64);
          auVar128._8_8_ = 0;
          auVar128._0_8_ = SUB168(auVar52 * ZEXT816(0x1000100010001),0);
          uVar42 = vpextrq_avx(auVar68._0_16_,1);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = SUB168(auVar51 * ZEXT816(0x1000100010001),0);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = SUB168(auVar11 * ZEXT816(0x1000100010001),0);
          auVar126._8_8_ = 0;
          auVar126._0_8_ = SUB168(auVar53 * ZEXT816(0x1000100010001),0);
          uVar43 = vpextrq_avx(auVar68._16_16_,1);
          auVar49 = vpunpcklqdq_avx512vl(auVar128,auVar124);
          auVar50 = vpunpcklqdq_avx512vl(auVar126,auVar122);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar44;
          auVar83._8_8_ = 0;
          auVar83._0_8_ = SUB168(auVar51 * ZEXT816(0x1000100010001),8);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = SUB168(auVar52 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx(auVar90,auVar83);
          auVar75._8_8_ = 0;
          auVar75._0_8_ = SUB168(auVar53 * ZEXT816(0x1000100010001),8);
          auVar79._8_8_ = 0;
          auVar79._0_8_ = SUB168(auVar11 * ZEXT816(0x1000100010001),8);
          auVar51 = vpunpcklqdq_avx512vl(auVar75,auVar79);
          auVar55 = vextracti64x4_avx512f(auVar68,1);
          auVar56 = vinserti32x4_avx512vl(ZEXT1632(auVar48),auVar49,1);
          uVar44 = vpextrq_avx(auVar55._0_16_,1);
          auVar64 = vmovdqu64_avx512f(ZEXT3264(CONCAT1616(ZEXT116(1) * auVar52,
                                                          ZEXT116(0) * auVar52 +
                                                          ZEXT116(1) * auVar47)));
          uVar46 = vpextrq_avx(auVar55._16_16_,1);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = SUB168(auVar13 * ZEXT816(0x1000100010001),0);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = SUB168(auVar12 * ZEXT816(0x1000100010001),0);
          auVar47 = vpunpcklqdq_avx512vl(auVar84,auVar47);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = auVar68._0_8_;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = SUB168(auVar12 * ZEXT816(0x1000100010001),8);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = SUB168(auVar13 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx512vl(auVar91,auVar108);
          auVar57 = vextracti64x4_avx512f(auVar71,1);
          auVar58 = vinserti32x4_avx512vl(ZEXT1632(auVar50),auVar47,1);
          auVar59 = vinserti32x4_avx512vl(ZEXT1632(auVar51),auVar52,1);
          auVar64 = vmovdqu64_avx512f(auVar64);
          auVar63 = vinserti64x4_avx512f(ZEXT3264(auVar56),auVar58,1);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar42;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = auVar68._16_8_;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar43;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = auVar55._0_8_;
          auVar139._8_8_ = 0;
          auVar139._0_8_ = SUB168(auVar14 * ZEXT816(0x1000100010001),8);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar44;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = auVar55._16_8_;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar46;
          auVar135._8_8_ = 0;
          auVar135._0_8_ = SUB168(auVar18 * ZEXT816(0x1000100010001),8);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = SUB168(auVar17 * ZEXT816(0x1000100010001),8);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = SUB168(auVar16 * ZEXT816(0x1000100010001),8);
          auVar47 = vpunpcklqdq_avx512vl(auVar142,auVar137);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = SUB168(auVar15 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx512vl(auVar139,auVar120);
          uVar42 = vpextrq_avx(auVar57._16_16_,1);
          auVar55 = vinserti32x4_avx512vl(ZEXT1632(auVar52),auVar47,1);
          auVar64 = vinserti64x4_avx512f(auVar64,auVar59,1);
          uVar43 = vpextrq_avx(auVar57._0_16_,1);
          uVar44 = vpextrq_avx(auVar71._0_16_,1);
          auVar63 = vpaddq_avx512f(auVar64,auVar63);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = SUB168(auVar20 * ZEXT816(0x1000100010001),0);
          auVar109._8_8_ = 0;
          auVar109._0_8_ = SUB168(auVar21 * ZEXT816(0x1000100010001),0);
          auVar47 = vpunpcklqdq_avx(auVar102,auVar109);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = SUB168(auVar19 * ZEXT816(0x1000100010001),8);
          auVar48 = vpunpcklqdq_avx512vl(auVar135,auVar92);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = auVar71._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = SUB168(auVar18 * ZEXT816(0x1000100010001),0);
          uVar46 = vpextrq_avx(auVar71._16_16_,1);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = SUB168(auVar20 * ZEXT816(0x1000100010001),8);
          auVar111._8_8_ = 0;
          auVar111._0_8_ = SUB168(auVar21 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx(auVar93,auVar111);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = SUB168(auVar16 * ZEXT816(0x1000100010001),0);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = SUB168(auVar17 * ZEXT816(0x1000100010001),0);
          auVar51 = vpunpcklqdq_avx(auVar76,auVar80);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = SUB168(auVar19 * ZEXT816(0x1000100010001),0);
          auVar53 = vpunpcklqdq_avx(auVar32,auVar31);
          auVar58._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar48;
          auVar58._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
          auVar67 = vinserti64x4_avx512f(ZEXT3264(auVar55),auVar58,1);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar44;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = auVar71._16_8_;
          uVar44 = SUB168(auVar24 * ZEXT816(0x1000100010001),8);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar46;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = auVar57._0_8_;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar43;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = auVar57._16_8_;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar42;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = SUB168(auVar29 * ZEXT816(0x1000100010001),0);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),0);
          auVar136._8_8_ = 0;
          auVar136._0_8_ = SUB168(auVar27 * ZEXT816(0x1000100010001),0);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = SUB168(auVar25 * ZEXT816(0x1000100010001),0);
          auVar140._8_8_ = 0;
          auVar140._0_8_ = SUB168(auVar24 * ZEXT816(0x1000100010001),0);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = SUB168(auVar15 * ZEXT816(0x1000100010001),0);
          auVar115._8_8_ = 0;
          auVar115._0_8_ = SUB168(auVar14 * ZEXT816(0x1000100010001),0);
          auVar52 = vpunpcklqdq_avx(auVar115,auVar85);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = SUB168(auVar28 * ZEXT816(0x1000100010001),8);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = SUB168(auVar26 * ZEXT816(0x1000100010001),8);
          auVar59._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar53;
          auVar59._16_16_ = ZEXT116(1) * auVar47;
          auVar134._8_8_ = 0;
          auVar134._0_8_ = SUB168(auVar27 * ZEXT816(0x1000100010001),8);
          auVar47 = vpunpcklqdq_avx512vl(auVar129,auVar134);
          auVar53 = vpunpcklqdq_avx512vl(auVar123,auVar121);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = SUB168(auVar25 * ZEXT816(0x1000100010001),8);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = uVar44;
          auVar48 = vpunpcklqdq_avx512vl(auVar141,auVar133);
          auVar64 = vmovdqa64_avx512f(auVar69);
          auVar71 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar51,
                                                   ZEXT116(0) * auVar51 + ZEXT116(1) * auVar52)),
                               auVar59,1);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = SUB168(auVar29 * ZEXT816(0x1000100010001),8);
          auVar52 = vpunpcklqdq_avx512vl(auVar127,auVar119);
          auVar55._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar47;
          auVar55._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = SUB168(auVar26 * ZEXT816(0x1000100010001),0);
          auVar47 = vpunpcklqdq_avx512vl(auVar112,auVar136);
          auVar52 = vpunpcklqdq_avx512vl(auVar140,auVar143);
          auVar67 = vpaddq_avx512f(auVar67,auVar71);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),0);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = SUB168(auVar22 * ZEXT816(0x1000100010001),0);
          auVar51 = vpunpcklqdq_avx512vl(auVar138,auVar94);
          auVar110._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar47;
          auVar110._16_16_ = ZEXT116(1) * auVar53;
          auVar67 = vpandq_avx512f(auVar67,auVar65);
          auVar71 = vmovdqa64_avx512f(in_ZMM31);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = SUB168(auVar22 * ZEXT816(0x1000100010001),8);
          auVar131._8_8_ = 0;
          auVar131._0_8_ = SUB168(auVar23 * ZEXT816(0x1000100010001),8);
          auVar47 = vpunpcklqdq_avx512vl(auVar125,auVar131);
          auVar62 = vmovdqa64_avx512f(auVar62);
          auVar68 = vpandq_avx512f(auVar65,auVar61);
          uVar36 = uVar36 + 8;
          local_1a8 = local_1a8 + 8;
          auVar69 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                   ZEXT116(1) * auVar52,
                                                   ZEXT116(0) * auVar52 + ZEXT116(1) * auVar51)),
                               auVar110,1);
          auVar61 = vpandq_avx512f(auVar63,auVar65);
          auVar70 = vmovdqa64_avx512f(auVar118);
          auVar63 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar48,
                                                   ZEXT116(0) * auVar48 + ZEXT116(1) * auVar47)),
                               auVar55,1);
          auVar72 = vmovdqa64_avx512f(auVar116);
          auVar73 = vmovdqa64_avx512f(auVar117);
          auVar117 = vpaddq_avx512f(auVar61,auVar117);
          auVar116 = vpaddq_avx512f(auVar67,auVar116);
          vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
          auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar67 = vpaddq_avx512f(auVar63,auVar69);
          auVar63 = vpbroadcastq_avx512f(ZEXT816(0x2222222222222222));
          auVar67 = vpandq_avx512f(auVar67,auVar65);
          in_ZMM31 = vpaddq_avx512f(auVar67,in_ZMM31);
          auVar118 = vpaddq_avx512f(auVar68,auVar118);
        } while ((((ulong)(uVar35 * 2) - 0x10 >> 4) + 8 & 0xfffffffffffffff8) != uVar36);
        auVar118 = vmovdqa64_avx512f(auVar118);
        auVar66._0_8_ =
             (ulong)(bVar1 & 1) * auVar118._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar70._0_8_;
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar66._8_8_ = (ulong)bVar2 * auVar118._8_8_ | (ulong)!bVar2 * auVar70._8_8_;
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar66._16_8_ = (ulong)bVar2 * auVar118._16_8_ | (ulong)!bVar2 * auVar70._16_8_;
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar66._24_8_ = (ulong)bVar2 * auVar118._24_8_ | (ulong)!bVar2 * auVar70._24_8_;
        bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
        auVar66._32_8_ = (ulong)bVar2 * auVar118._32_8_ | (ulong)!bVar2 * auVar70._32_8_;
        bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
        auVar66._40_8_ = (ulong)bVar2 * auVar118._40_8_ | (ulong)!bVar2 * auVar70._40_8_;
        bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
        auVar66._48_8_ = (ulong)bVar2 * auVar118._48_8_ | (ulong)!bVar2 * auVar70._48_8_;
        auVar66._56_8_ =
             (uVar3 >> 7) * auVar118._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar70._56_8_;
        auVar55 = vextracti64x4_avx512f(auVar66,1);
        auVar117 = vmovdqa64_avx512f(auVar117);
        auVar118._0_8_ =
             (ulong)(bVar1 & 1) * auVar117._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar73._0_8_;
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar118._8_8_ = (ulong)bVar2 * auVar117._8_8_ | (ulong)!bVar2 * auVar73._8_8_;
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar118._16_8_ = (ulong)bVar2 * auVar117._16_8_ | (ulong)!bVar2 * auVar73._16_8_;
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar118._24_8_ = (ulong)bVar2 * auVar117._24_8_ | (ulong)!bVar2 * auVar73._24_8_;
        bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
        auVar118._32_8_ = (ulong)bVar2 * auVar117._32_8_ | (ulong)!bVar2 * auVar73._32_8_;
        bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
        auVar118._40_8_ = (ulong)bVar2 * auVar117._40_8_ | (ulong)!bVar2 * auVar73._40_8_;
        bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
        auVar118._48_8_ = (ulong)bVar2 * auVar117._48_8_ | (ulong)!bVar2 * auVar73._48_8_;
        auVar118._56_8_ =
             (uVar3 >> 7) * auVar117._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar73._56_8_;
        auVar117 = vmovdqa64_avx512f(auVar116);
        auVar116._0_8_ =
             (ulong)(bVar1 & 1) * auVar117._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar72._0_8_;
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar116._8_8_ = (ulong)bVar2 * auVar117._8_8_ | (ulong)!bVar2 * auVar72._8_8_;
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar116._16_8_ = (ulong)bVar2 * auVar117._16_8_ | (ulong)!bVar2 * auVar72._16_8_;
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar116._24_8_ = (ulong)bVar2 * auVar117._24_8_ | (ulong)!bVar2 * auVar72._24_8_;
        bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
        auVar116._32_8_ = (ulong)bVar2 * auVar117._32_8_ | (ulong)!bVar2 * auVar72._32_8_;
        bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
        auVar116._40_8_ = (ulong)bVar2 * auVar117._40_8_ | (ulong)!bVar2 * auVar72._40_8_;
        bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
        auVar116._48_8_ = (ulong)bVar2 * auVar117._48_8_ | (ulong)!bVar2 * auVar72._48_8_;
        auVar116._56_8_ =
             (uVar3 >> 7) * auVar117._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar72._56_8_;
        auVar117 = vmovdqa64_avx512f(in_ZMM31);
        auVar67._0_8_ =
             (ulong)(bVar1 & 1) * auVar117._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar71._0_8_;
        bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
        auVar67._8_8_ = (ulong)bVar2 * auVar117._8_8_ | (ulong)!bVar2 * auVar71._8_8_;
        bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
        auVar67._16_8_ = (ulong)bVar2 * auVar117._16_8_ | (ulong)!bVar2 * auVar71._16_8_;
        bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
        auVar67._24_8_ = (ulong)bVar2 * auVar117._24_8_ | (ulong)!bVar2 * auVar71._24_8_;
        bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
        auVar67._32_8_ = (ulong)bVar2 * auVar117._32_8_ | (ulong)!bVar2 * auVar71._32_8_;
        bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
        auVar67._40_8_ = (ulong)bVar2 * auVar117._40_8_ | (ulong)!bVar2 * auVar71._40_8_;
        bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
        auVar67._48_8_ = (ulong)bVar2 * auVar117._48_8_ | (ulong)!bVar2 * auVar71._48_8_;
        auVar67._56_8_ =
             (uVar3 >> 7) * auVar117._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar71._56_8_;
        uVar39 = uVar39 & 0xffffffff;
        auVar117 = vpaddq_avx512f(auVar66,ZEXT3264(auVar55));
        auVar47 = vpaddq_avx(auVar117._0_16_,auVar117._16_16_);
        auVar52 = vpshufd_avx(auVar47,0xee);
        auVar47 = vpaddq_avx(auVar47,auVar52);
        uVar34 = auVar47._0_8_;
        auVar55 = vextracti64x4_avx512f(auVar118,1);
        auVar117 = vpaddq_avx512f(auVar118,ZEXT3264(auVar55));
        auVar47 = vpaddq_avx(auVar117._0_16_,auVar117._16_16_);
        auVar52 = vpshufd_avx(auVar47,0xee);
        auVar47 = vpaddq_avx(auVar47,auVar52);
        auVar60 = vmovdqu64_avx512f(auVar60);
        uVar37 = auVar47._0_8_;
        auVar55 = vextracti64x4_avx512f(auVar116,1);
        auVar117 = vpaddq_avx512f(auVar116,ZEXT3264(auVar55));
        auVar47 = vpaddq_avx(auVar117._0_16_,auVar117._16_16_);
        auVar52 = vpshufd_avx(auVar47,0xee);
        auVar47 = vpaddq_avx(auVar47,auVar52);
        uVar45 = auVar47._0_8_;
        auVar55 = vextracti64x4_avx512f(auVar67,1);
        auVar117 = vpaddq_avx512f(auVar67,ZEXT3264(auVar55));
        auVar47 = vpaddq_avx(auVar117._0_16_,auVar117._16_16_);
        auVar52 = vpshufd_avx(auVar47,0xee);
        auVar47 = vpaddq_avx(auVar47,auVar52);
        uVar41 = auVar47._0_8_;
        local_1a8 = (undefined1 (*) [16])(puVar33 + (ulong)uVar40 * 2);
      }
      uVar40 = (int)uVar39 - uVar40;
      uVar39 = (ulong)uVar40;
      auVar95._8_4_ = 0xfff;
      auVar95._0_8_ = 0xfff00000fff;
      auVar95._12_4_ = 0xfff;
      auVar96._16_4_ = 0xfff;
      auVar96._0_16_ = auVar95;
      auVar96._20_4_ = 0xfff;
      auVar96._24_4_ = 0xfff;
      auVar96._28_4_ = 0xfff;
      auVar47 = vpinsrd_avx(ZEXT416((uint)uVar34),(int)uVar37,1);
      auVar47 = vpinsrd_avx(auVar47,(int)uVar45,2);
      auVar52 = vpinsrd_avx(ZEXT416((uint)((ulong)uVar34 >> 0x18)),(int)((ulong)uVar37 >> 0x18),1);
      auVar52 = vpinsrd_avx(auVar52,(int)((ulong)uVar45 >> 0x18),2);
      auVar47 = vpinsrd_avx(auVar47,(int)uVar41,3);
      auVar51 = vpsrld_avx(auVar47,0xc);
      auVar52 = vpinsrd_avx(auVar52,(int)((ulong)uVar41 >> 0x18),3);
      auVar77._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar52;
      auVar77._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
      auVar52 = vpinsrd_avx(ZEXT416((uint)((ulong)uVar34 >> 0x24)),(uint)((ulong)uVar37 >> 0x24),1);
      auVar52 = vpinsrd_avx(auVar52,(uint)((ulong)uVar45 >> 0x24),2);
      auVar52 = vpinsrd_avx(auVar52,(uint)((ulong)uVar41 >> 0x24),3);
      auVar47 = vpand_avx(auVar47,auVar95);
      auVar55 = vpand_avx2(auVar77,auVar96);
      auVar117 = vinserti64x4_avx512f
                           (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                ZEXT116(1) * auVar52,
                                                ZEXT116(0) * auVar52 + ZEXT116(1) * auVar47)),
                            auVar55,1);
      auVar60 = vpaddd_avx512f(auVar60,auVar117);
      auVar117 = vmovdqu64_avx512f(auVar60);
      *(undefined1 (*) [64])out = auVar117;
    } while (7 < uVar40);
  }
  if ((int)uVar39 != 0) {
    auVar65 = vpbroadcastq_avx512f(ZEXT816(0x5555));
    auVar64 = vpbroadcastq_avx512f(ZEXT816(0x40010004001));
    auVar62 = vpbroadcastq_avx512f(ZEXT816(0x101010101010101));
    auVar61 = vpbroadcastq_avx512f();
    uVar39 = vpcmpuq_avx512f(auVar61,_DAT_0011f6c0,5);
    auVar47 = vmovdqu16_avx512vl(*local_1a8);
    bVar1 = (byte)uVar39;
    auVar54._2_2_ = (ushort)((byte)(uVar39 >> 1) & 1) * auVar47._2_2_;
    auVar54._0_2_ = (ushort)(bVar1 & 1) * auVar47._0_2_;
    auVar54._4_2_ = (ushort)((byte)(uVar39 >> 2) & 1) * auVar47._4_2_;
    auVar54._6_2_ = (ushort)((byte)(uVar39 >> 3) & 1) * auVar47._6_2_;
    auVar54._8_2_ = (ushort)((byte)(uVar39 >> 4) & 1) * auVar47._8_2_;
    auVar54._10_2_ = (ushort)((byte)(uVar39 >> 5) & 1) * auVar47._10_2_;
    auVar54._12_2_ = (ushort)((byte)(uVar39 >> 6) & 1) * auVar47._12_2_;
    auVar54._14_2_ = (ushort)(byte)(uVar39 >> 7) * auVar47._14_2_;
    auVar61 = vpmovzxwq_avx512f(auVar54);
    auVar63 = vpandq_avx512f(auVar61,auVar65);
    auVar61 = vpsrlq_avx512f(auVar61,1);
    auVar63 = vpmullq_avx512dq(auVar63,auVar64);
    auVar65 = vpandq_avx512f(auVar61,auVar65);
    auVar65 = vpmullq_avx512dq(auVar65,auVar64);
    auVar64 = vpandq_avx512f(auVar63,auVar62);
    auVar63._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar64._8_8_;
    auVar63._0_8_ = (ulong)(bVar1 & 1) * auVar64._0_8_;
    auVar63._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar64._16_8_;
    auVar63._24_8_ = (ulong)((byte)(uVar39 >> 3) & 1) * auVar64._24_8_;
    auVar63._32_8_ = (ulong)((byte)(uVar39 >> 4) & 1) * auVar64._32_8_;
    auVar63._40_8_ = (ulong)((byte)(uVar39 >> 5) & 1) * auVar64._40_8_;
    auVar63._48_8_ = (ulong)((byte)(uVar39 >> 6) & 1) * auVar64._48_8_;
    auVar63._56_8_ = (uVar39 >> 7) * auVar64._56_8_;
    auVar55 = vextracti64x4_avx512f(auVar63,1);
    auVar65 = vpandq_avx512f(auVar65,auVar62);
    auVar64._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar65._8_8_;
    auVar64._0_8_ = (ulong)(bVar1 & 1) * auVar65._0_8_;
    auVar64._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar65._16_8_;
    auVar64._24_8_ = (ulong)((byte)(uVar39 >> 3) & 1) * auVar65._24_8_;
    auVar64._32_8_ = (ulong)((byte)(uVar39 >> 4) & 1) * auVar65._32_8_;
    auVar64._40_8_ = (ulong)((byte)(uVar39 >> 5) & 1) * auVar65._40_8_;
    auVar64._48_8_ = (ulong)((byte)(uVar39 >> 6) & 1) * auVar65._48_8_;
    auVar64._56_8_ = (uVar39 >> 7) * auVar65._56_8_;
    auVar65 = vpaddq_avx512f(auVar63,ZEXT3264(auVar55));
    auVar47 = vpaddq_avx(auVar65._0_16_,auVar65._16_16_);
    auVar52 = vpshufd_avx(auVar47,0xee);
    auVar47 = vpaddq_avx(auVar47,auVar52);
    auVar55 = vextracti64x4_avx512f(auVar64,1);
    auVar65 = vpaddq_avx512f(auVar64,ZEXT3264(auVar55));
    auVar52 = vpaddq_avx(auVar65._0_16_,auVar65._16_16_);
    auVar51 = vpshufd_avx(auVar52,0xee);
    auVar52 = vpaddq_avx(auVar52,auVar51);
    auVar53 = vpunpckldq_avx(auVar47,auVar52);
    auVar48 = vpunpcklqdq_avx(auVar47,auVar52);
    auVar51 = vpshufb_avx(auVar48,_DAT_0011f030);
    auVar97._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar48;
    auVar97._16_16_ = ZEXT116(1) * auVar48;
    auVar55 = vpsrlvq_avx2(auVar97,_DAT_00121fc0);
    auVar49 = vpsrld_avx(auVar53,8);
    auVar53 = vpshufb_avx(auVar53,_DAT_0011f040);
    auVar48 = vpsrlq_avx(auVar48,0x38);
    auVar47 = vpinsrd_avx(auVar49,auVar47._0_4_,2);
    auVar47 = vpinsrd_avx(auVar47,auVar52._0_4_,3);
    auVar47 = vpshufb_avx(auVar47,_DAT_0011f020);
    auVar52 = vpmovqd_avx512vl(auVar55);
    auVar86._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar53;
    auVar86._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
    auVar30._8_4_ = 0xff;
    auVar30._0_8_ = 0xff000000ff;
    auVar30._12_4_ = 0xff;
    auVar30._16_4_ = 0xff;
    auVar30._20_4_ = 0xff;
    auVar30._24_4_ = 0xff;
    auVar30._28_4_ = 0xff;
    auVar55 = vpandd_avx512vl(auVar86,auVar30);
    auVar65 = vinserti32x4_avx512f(ZEXT3264(auVar55),auVar47,2);
    auVar64 = vpmovsxbd_avx512f(_DAT_0011f050);
    auVar65 = vinserti32x4_avx512f(auVar65,auVar51,3);
    auVar65 = vpermi2d_avx512f(auVar64,auVar65,ZEXT1664(auVar48));
    auVar65 = vpaddd_avx512f(auVar65,*(undefined1 (*) [64])out);
    auVar65 = vmovdqu64_avx512f(auVar65);
    *(undefined1 (*) [64])out = auVar65;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128_unroll2(const uint16_t* in, uint32_t n, uint32_t* out) {
    while (n >= 8) {
        uint64_t counter_a = 0; // 4 packed 12-bit counters
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // end before overflowing the counters
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~7;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 8) {
            const uint64_t mask_a = UINT64_C(0x1111111111111111);
            const uint64_t mask_b = mask_a + mask_a;
            const uint64_t mask_c = mask_b + mask_b;
            const uint64_t mask_0001 = UINT64_C(0x0001000100010001);
            const uint64_t mask_cnts = UINT64_C(0x000000F00F00F00F);

            uint64_t v0 = pospopcnt_loadu_u64(&in[0]);
            uint64_t v1 = pospopcnt_loadu_u64(&in[4]);

            uint64_t a = (v0 & mask_a) + (v1 & mask_a);
            uint64_t b = ((v0 & mask_b) + (v1 & mask_b)) >> 1;
            uint64_t c = ((v0 & mask_c) + (v1 & mask_c)) >> 2;
            uint64_t d = ((v0 >> 3) & mask_a) + ((v1 >> 3) & mask_a);

            uint64_t hi;
            a = pospopcnt_umul128(a, mask_0001, &hi);
            a += hi; // broadcast 4-bit counts
            b = pospopcnt_umul128(b, mask_0001, &hi);
            b += hi;
            c = pospopcnt_umul128(c, mask_0001, &hi);
            c += hi;
            d = pospopcnt_umul128(d, mask_0001, &hi);
            d += hi;

            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d & mask_cnts;
        }

        out[0] += counter_a & 0x0FFF;
        out[1] += counter_b & 0x0FFF;
        out[2] += counter_c & 0x0FFF;
        out[3] += counter_d & 0x0FFF;
        out[4] += (counter_a >> 36);
        out[5] += (counter_b >> 36);
        out[6] += (counter_c >> 36);
        out[7] += (counter_d >> 36);
        out[8] += (counter_a >> 24) & 0x0FFF;
        out[9] += (counter_b >> 24) & 0x0FFF;
        out[10] += (counter_c >> 24) & 0x0FFF;
        out[11] += (counter_d >> 24) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d >> 12) & 0x0FFF;
    }

    // assert(n < 8)
    if (n != 0) {
        uint64_t tail_counter_a = 0;
        uint64_t tail_counter_b = 0;
        do { // zero-extend a bit to 8-bits (emulate pdep) then accumulate
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);
            const uint64_t magic   = UINT64_C(0x0000040010004001); // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *in++;
            tail_counter_a += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            tail_counter_b += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--n);

        out[0]  += tail_counter_a & 0xFF;
        out[8]  += (tail_counter_a >>  8) & 0xFF;
        out[2]  += (tail_counter_a >> 16) & 0xFF;
        out[10] += (tail_counter_a >> 24) & 0xFF;
        out[4]  += (tail_counter_a >> 32) & 0xFF;
        out[12] += (tail_counter_a >> 40) & 0xFF;
        out[6]  += (tail_counter_a >> 48) & 0xFF;
        out[14] += (tail_counter_a >> 56) & 0xFF;
        out[1]  += tail_counter_b & 0xFF;
        out[9]  += (tail_counter_b >>  8) & 0xFF;
        out[3]  += (tail_counter_b >> 16) & 0xFF;
        out[11] += (tail_counter_b >> 24) & 0xFF;
        out[5]  += (tail_counter_b >> 32) & 0xFF;
        out[13] += (tail_counter_b >> 40) & 0xFF;
        out[7]  += (tail_counter_b >> 48) & 0xFF;
        out[15] += (tail_counter_b >> 56) & 0xFF;
    }

    return 0;
}